

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<6UL,_GF2::MOGrevlex<6UL>_> * __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::SPoly
          (MP<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *poly)

{
  bool bVar1;
  list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *this_00;
  MM<6UL> *mRight;
  _Self *__x;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_RDI;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *unaff_retaddr;
  const_iterator iter_1;
  iterator iter;
  MM<6UL> m;
  MM<6UL> lm;
  list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *in_stack_ffffffffffffff98;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffffa0;
  _Self in_stack_ffffffffffffffc0;
  _List_const_iterator<GF2::MM<6UL>_> local_38;
  _Self local_30;
  _Self local_28 [5];
  
  MM<6UL>::MM((MM<6UL> *)0x1c6742);
  MM<6UL>::MM((MM<6UL> *)0x1c674c);
  this_00 = (list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)LM(in_stack_ffffffffffffffa0);
  mRight = LM(in_stack_ffffffffffffffa0);
  LM(in_stack_ffffffffffffffa0);
  MM<6UL>::LCM((MM<6UL> *)in_stack_ffffffffffffffc0._M_node,(MM<6UL> *)in_RDI,(MM<6UL> *)this_00);
  MM<6UL>::operator=((MM<6UL> *)in_stack_ffffffffffffffa0,(MM<6UL> *)in_stack_ffffffffffffff98);
  MM<6UL>::operator/=((MM<6UL> *)this_00,mRight);
  PopLM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c67aa);
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                 (in_stack_ffffffffffffff98);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                   (in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    std::_List_iterator<GF2::MM<6UL>_>::operator*((_List_iterator<GF2::MM<6UL>_> *)0x1c67e7);
    MM<6ul>::operator*=((MM<6UL> *)in_stack_ffffffffffffffa0,(MM<6UL> *)in_stack_ffffffffffffff98);
    std::_List_iterator<GF2::MM<6UL>_>::operator++(local_28);
  }
  LM(in_stack_ffffffffffffffa0);
  MM<6UL>::operator/=((MM<6UL> *)this_00,mRight);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                 (in_stack_ffffffffffffff98);
  while( true ) {
    __x = std::_List_const_iterator<GF2::MM<6UL>_>::operator++(&local_38);
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end(in_stack_ffffffffffffff98)
    ;
    bVar1 = std::operator!=(__x,(_Self *)&stack0xffffffffffffffc0);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<6UL>_>::operator*(__x);
    MM<6UL>::operator=((MM<6UL> *)__x,(MM<6UL> *)in_stack_ffffffffffffff98);
    MM<6ul>::operator*=((MM<6UL> *)__x,(MM<6UL> *)in_stack_ffffffffffffff98);
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::push_back(this_00,mRight);
  }
  Normalize(unaff_retaddr);
  return in_RDI;
}

Assistant:

MP& SPoly(const MP& poly)
	{
		// предусловия
		assert(IsConsistent(poly) && this != &poly);
		// сбор мономов
		MM<_n> lm, m;
		(m = lm.LCM(LM(), poly.LM())) /= LM();
		PopLM();
		for (iterator iter = begin(); iter != end(); ++iter)
			*iter *= m;
		lm /= poly.LM();
		for (const_iterator iter = poly.begin(); ++iter != poly.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}